

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O2

void __thiscall
OpenMD::HydroIO::writeHydroProp
          (HydroIO *this,HydroProp *hp,RealType viscosity,RealType temperature,ostream *os)

{
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_00;
  uint j;
  long lVar1;
  uint i;
  long lVar2;
  uint i_4;
  double (*__return_storage_ptr__) [6];
  uint i_2;
  allocator<char> *this_01;
  double (*pitchAxes_00) [3];
  RealType pitchScalar;
  Vector3d cod;
  string name;
  string h;
  Vector3d pitches;
  Vector3d cop;
  Vector3d cor;
  Mat3x3d pitchAxes;
  Mat6x6d Xi;
  Mat6x6d Xid;
  double local_378;
  Vector<double,_3U> local_370;
  Ch *local_358 [4];
  string local_338 [32];
  Vector<double,_3U> local_318;
  Vector3d local_300;
  Vector<double,_3U> local_2e8;
  Vector<double,_3U> local_2d0;
  SquareMatrix<double,_3> local_2b8;
  allocator<char> local_270 [288];
  double local_150 [36];
  
  if (this->writerOpen_ == false) {
    openWriter(this,os);
  }
  std::__cxx11::string::string<std::allocator<char>>(local_338,"OpenMD-Hydro",local_270);
  std::__cxx11::string::string((string *)local_358,(string *)hp);
  Vector<double,_3U>::Vector(&local_2d0,&(hp->cor_).super_Vector<double,_3U>);
  this_01 = local_270;
  RectMatrix<double,_6U,_6U>::operator=
            ((RectMatrix<double,_6U,_6U> *)this_01,&(hp->Xi_).super_RectMatrix<double,_6U,_6U>);
  HydroProp::getCenterOfDiffusion((Vector3d *)&local_370,hp,temperature);
  Vector<double,_3U>::Vector(&local_2e8,&local_370);
  __return_storage_ptr__ = (double (*) [6])local_150;
  HydroProp::getDiffusionTensorAtPos
            ((Mat6x6d *)__return_storage_ptr__,hp,(Vector3d *)&local_2e8,temperature);
  HydroProp::getCenterOfPitch(&local_300,hp);
  SquareMatrix<double,_3>::SquareMatrix(&local_2b8);
  Vector<double,_3U>::Vector(&local_318);
  pitchAxes_00 = (double (*) [3])&local_2b8;
  HydroProp::pitchAxes(hp,(Mat3x3d *)pitchAxes_00,(Vector3d *)&local_318,&local_378);
  this_00 = &this->w_;
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(this_00);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_00,"name");
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,local_358[0]);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_00,"viscosity");
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Double(this_00,viscosity);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_00,"centerOfResistance");
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  (this->w_).formatOptions_ = kFormatSingleLineArray;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(this_00,local_2d0.data_[lVar2]);
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  (this->w_).formatOptions_ = kFormatDefault;
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_00,"resistanceTensor");
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(this_00);
    (this->w_).formatOptions_ = kFormatSingleLineArray;
    for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
      rapidjson::
      PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ::Double(this_00,*(double *)(this_01 + lVar1 * 8));
    }
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(this_00,0);
    (this->w_).formatOptions_ = kFormatDefault;
    this_01 = this_01 + 0x30;
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_00,"temperature");
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Double(this_00,temperature);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_00,"centerOfDiffusion");
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  (this->w_).formatOptions_ = kFormatSingleLineArray;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(this_00,local_370.data_[lVar2]);
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  (this->w_).formatOptions_ = kFormatDefault;
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_00,"diffusionTensor");
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(this_00);
    (this->w_).formatOptions_ = kFormatSingleLineArray;
    for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
      rapidjson::
      PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ::Double(this_00,((RectMatrix<double,_6U,_6U> *)*__return_storage_ptr__)->data_[0][lVar1]);
    }
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(this_00,0);
    (this->w_).formatOptions_ = kFormatDefault;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_00,"pitch");
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Double(this_00,local_378);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_00,"centerOfPitch");
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  (this->w_).formatOptions_ = kFormatSingleLineArray;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(this_00,local_300.super_Vector<double,_3U>.data_[lVar2]);
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  (this->w_).formatOptions_ = kFormatDefault;
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_00,"momentsOfPitch");
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  (this->w_).formatOptions_ = kFormatSingleLineArray;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(this_00,local_318.data_[lVar2]);
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  (this->w_).formatOptions_ = kFormatDefault;
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(this_00,"pitchAxes");
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(this_00);
    (this->w_).formatOptions_ = kFormatSingleLineArray;
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      rapidjson::
      PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ::Double(this_00,(((SquareMatrix<double,_3> *)*pitchAxes_00)->super_RectMatrix<double,_3U,_3U>
                       ).data_[0][lVar1]);
    }
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(this_00,0);
    (this->w_).formatOptions_ = kFormatDefault;
    pitchAxes_00 = pitchAxes_00 + 1;
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this_00,0);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(this_00,0);
  std::__cxx11::string::~string((string *)local_358);
  std::__cxx11::string::~string(local_338);
  return;
}

Assistant:

void HydroIO::writeHydroProp(HydroProp* hp, RealType viscosity,
                               RealType temperature, std::ostream& os) {
    if (!writerOpen_) openWriter(os);

    std::string h    = "OpenMD-Hydro";
    std::string name = hp->getName();
    Vector3d cor     = hp->getCenterOfResistance();
    Mat6x6d Xi       = hp->getResistanceTensor();
    Vector3d cod     = hp->getCenterOfDiffusion(temperature);
    Mat6x6d Xid      = hp->getDiffusionTensorAtPos(cod, temperature);
    Vector3d cop     = hp->getCenterOfPitch();
    Mat3x3d pitchAxes;
    Vector3d pitches;
    RealType pitchScalar;

    hp->pitchAxes(pitchAxes, pitches, pitchScalar);

#if defined(NLOHMANN_JSON)

    ordered_json o;
    o["name"]               = name;
    o["viscosity"]          = viscosity;
    o["centerOfResistance"] = {cor[0], cor[1], cor[2]};
    o["resistanceTensor"]   = json::array();

    for (unsigned int i = 0; i < 6; i++) {
      o["resistanceTensor"][i] = {Xi(i, 0), Xi(i, 1), Xi(i, 2),
                                  Xi(i, 3), Xi(i, 4), Xi(i, 5)};
    }

    o["temperature"]       = temperature;
    o["centerOfDiffusion"] = {cod[0], cod[1], cod[2]};
    o["diffusionTensor"]   = json::array();

    for (unsigned int i = 0; i < 6; i++) {
      o["diffusionTensor"][i] = {Xid(i, 0), Xid(i, 1), Xid(i, 2),
                                 Xid(i, 3), Xid(i, 4), Xid(i, 5)};
    }

    o["pitch"]          = pitchScalar;
    o["centerOfPitch"]  = {cop[0], cop[1], cop[2]};
    o["momentsOfPitch"] = {pitches[0], pitches[1], pitches[2]};

    o["pitchAxes"] = json::array();
    for (unsigned int i = 0; i < 3; i++) {
      o["pitchAxes"][i] = {pitchAxes(i, 0), pitchAxes(i, 1), pitchAxes(i, 2)};
    }

    j_[h].push_back(o);

#elif defined(RAPID_JSON)

    w_.StartObject();
    w_.Key("name");
    w_.String(name.c_str());

    w_.Key("viscosity");
    w_.Double(viscosity);
    w_.Key("centerOfResistance");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);

    for (unsigned i = 0; i < 3; i++)
      w_.Double(cor[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("resistanceTensor");
    w_.StartArray();
    for (unsigned i = 0; i < 6; i++) {
      w_.StartArray();
      w_.SetFormatOptions(kFormatSingleLineArray);

      for (unsigned j = 0; j < 6; j++) {
        w_.Double(Xi(i, j));
      }
      w_.EndArray();
      w_.SetFormatOptions(kFormatDefault);
    }
    w_.EndArray();

    w_.Key("temperature");
    w_.Double(temperature);
    w_.Key("centerOfDiffusion");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);

    for (unsigned i = 0; i < 3; i++)
      w_.Double(cod[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("diffusionTensor");
    w_.StartArray();
    for (unsigned i = 0; i < 6; i++) {
      w_.StartArray();
      w_.SetFormatOptions(kFormatSingleLineArray);

      for (unsigned j = 0; j < 6; j++) {
        w_.Double(Xid(i, j));
      }
      w_.EndArray();
      w_.SetFormatOptions(kFormatDefault);
    }
    w_.EndArray();

    w_.Key("pitch");
    w_.Double(pitchScalar);

    w_.Key("centerOfPitch");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);
    for (unsigned i = 0; i < 3; i++)
      w_.Double(cop[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("momentsOfPitch");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);
    for (unsigned i = 0; i < 3; i++)
      w_.Double(pitches[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("pitchAxes");
    w_.StartArray();
    for (unsigned i = 0; i < 3; i++) {
      w_.StartArray();
      w_.SetFormatOptions(kFormatSingleLineArray);
      for (unsigned j = 0; j < 3; j++) {
        w_.Double(pitchAxes(i, j));
      }
      w_.EndArray();
      w_.SetFormatOptions(kFormatDefault);
    }
    w_.EndArray();

    w_.EndObject();
#endif
  }